

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::ReportExceptionBreak(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  code *pcVar1;
  ResolvedObject resolvedObject_00;
  anon_class_16_2_36d5672a postFunction;
  DynamicObject *object;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  DebugContext *this_00;
  ProbeContainer *this_01;
  JavascriptLibrary *this_02;
  JsrtDebuggerObjectsManager *debuggerObjectsManager;
  undefined1 auStack_a8 [8];
  ResolvedObject resolvedObject;
  int currentByteCodeOffset;
  FunctionBody *functionBody;
  DynamicObject *local_48;
  DynamicObject *eventDataObject;
  JsrtDebugEventObject debugEventObject;
  ScriptContext *pSStack_28;
  JsDiagDebugEvent jsDiagDebugEvent;
  ScriptContext *scriptContext;
  Utf8SourceInfo *utf8SourceInfo;
  InterpreterHaltState *haltState_local;
  JsrtDebugManager *this_local;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    utf8SourceInfo = (Utf8SourceInfo *)haltState;
    haltState_local = (InterpreterHaltState *)this;
    if (haltState->stopType != STOP_EXCEPTIONTHROW) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x12d,"(haltState->stopType == Js::STOP_EXCEPTIONTHROW)",
                         "haltState->stopType == Js::STOP_EXCEPTIONTHROW");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pFVar4 = Js::InterpreterHaltState::GetFunction((InterpreterHaltState *)utf8SourceInfo);
    scriptContext = (ScriptContext *)Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFVar4);
    pSStack_28 = Js::Utf8SourceInfo::GetScriptContext((Utf8SourceInfo *)scriptContext);
    debugEventObject.scriptContext._4_4_ = JsDiagDebugEventRuntimeException;
    JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)&eventDataObject,pSStack_28);
    local_48 = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)&eventDataObject);
    JsrtDebugUtils::AddScriptIdToObject(local_48,(Utf8SourceInfo *)scriptContext);
    pFVar4 = Js::DiagStackFrame::GetFunction((DiagStackFrame *)(utf8SourceInfo->sourceHolder).ptr);
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x13c,"(functionBody != nullptr)","functionBody != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    resolvedObject._60_4_ =
         (*(((utf8SourceInfo->sourceHolder).ptr)->super_FinalizableObject).
           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[3])();
    JsrtDebugUtils::AddLineColumnToObject(local_48,pFVar4,resolvedObject._60_4_);
    JsrtDebugUtils::AddSourceLengthAndTextToObject(local_48,pFVar4,resolvedObject._60_4_);
    object = local_48;
    JsrtDebugPropertyId::JsrtDebugPropertyId((JsrtDebugPropertyId *)&resolvedObject.typeId,uncaught)
    ;
    bVar2 = Js::JavascriptExceptionObject::IsFirstChanceException
                      ((JavascriptExceptionObject *)(utf8SourceInfo->topLevelFunctionInfoList).ptr);
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)resolvedObject.typeId,(bool)(~bVar2 & 1),pSStack_28);
    Js::ResolvedObject::ResolvedObject((ResolvedObject *)auStack_a8);
    resolvedObject._0_8_ = pSStack_28;
    resolvedObject.originalObj = anon_var_dwarf_1bbb0c;
    resolvedObject.name._0_4_ = 0x24;
    resolvedObject.scriptContext = (ScriptContext *)0x0;
    this_00 = Js::ScriptContext::GetDebugContext(pSStack_28);
    this_01 = Js::DebugContext::GetProbeContainer(this_00);
    resolvedObject.objectDisplay =
         (IDiagObjectModelDisplay *)Js::ProbeContainer::GetExceptionObject(this_01);
    if (resolvedObject.objectDisplay == (IDiagObjectModelDisplay *)0x0) {
      this_02 = Js::ScriptContext::GetLibrary((ScriptContext *)resolvedObject._0_8_);
      resolvedObject.objectDisplay =
           (IDiagObjectModelDisplay *)
           Js::JavascriptLibraryBase::GetUndefined(&this_02->super_JavascriptLibraryBase);
    }
    debuggerObjectsManager = GetDebuggerObjectsManager(this);
    resolvedObject_00._60_4_ = resolvedObject.name._4_4_;
    resolvedObject_00.typeId = resolvedObject.name._0_4_;
    postFunction.scriptContext = &stack0xffffffffffffffd8;
    postFunction.eventDataObject = &local_48;
    resolvedObject_00.scriptContext = (ScriptContext *)resolvedObject._0_8_;
    resolvedObject_00._0_8_ = auStack_a8;
    resolvedObject_00.address = (IDiagObjectAddress *)resolvedObject.scriptContext;
    resolvedObject_00.objectDisplay = (IDiagObjectModelDisplay *)resolvedObject.address;
    resolvedObject_00.obj = resolvedObject.objectDisplay;
    resolvedObject_00.originalObj = resolvedObject.obj;
    resolvedObject_00.name = (LPCWSTR)resolvedObject.originalObj;
    JsrtDebuggerObjectBase::
    CreateDebuggerObject<JsrtDebuggerObjectProperty,JsrtDebugManager::ReportExceptionBreak(Js::InterpreterHaltState*)::__0>
              (debuggerObjectsManager,resolvedObject_00,pSStack_28,false,postFunction);
    CallDebugEventCallbackForBreak(this,debugEventObject.scriptContext._4_4_,local_48,pSStack_28);
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)&eventDataObject);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportExceptionBreak(Js::InterpreterHaltState* haltState)
{
    if (this->debugEventCallback != nullptr)
    {
        Assert(haltState->stopType == Js::STOP_EXCEPTIONTHROW);

        Js::Utf8SourceInfo* utf8SourceInfo = haltState->GetFunction()->GetUtf8SourceInfo();
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsDiagDebugEvent jsDiagDebugEvent = JsDiagDebugEventRuntimeException;

        JsrtDebugEventObject debugEventObject(scriptContext);

        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        JsrtDebugUtils::AddScriptIdToObject(eventDataObject, utf8SourceInfo);

        Js::FunctionBody* functionBody = haltState->topFrame->GetFunction();

        Assert(functionBody != nullptr);
        
        int currentByteCodeOffset = haltState->topFrame->GetByteCodeOffset();
        JsrtDebugUtils::AddLineColumnToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddSourceLengthAndTextToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::uncaught, !haltState->exceptionObject->IsFirstChanceException(), scriptContext);

        Js::ResolvedObject resolvedObject;
        resolvedObject.scriptContext = scriptContext;
        resolvedObject.name = _u("{exception}");
        resolvedObject.typeId = Js::TypeIds_Error;
        resolvedObject.address = nullptr;
        resolvedObject.obj = scriptContext->GetDebugContext()->GetProbeContainer()->GetExceptionObject();

        if (resolvedObject.obj == nullptr)
        {
            resolvedObject.obj = resolvedObject.scriptContext->GetLibrary()->GetUndefined();
        }

        JsrtDebuggerObjectBase::CreateDebuggerObject<JsrtDebuggerObjectProperty>(this->GetDebuggerObjectsManager(), resolvedObject, scriptContext, /* forceSetValueProp */ false, [&](Js::Var marshaledObj)
        {
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::exception, marshaledObj, scriptContext);
        });
        
        this->CallDebugEventCallbackForBreak(jsDiagDebugEvent, eventDataObject, scriptContext);
    }
}